

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexical.h
# Opt level: O1

void __thiscall Lexical::Lexical(Lexical *this,Parsing *parsing_)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  string local_a8;
  int local_88 [4];
  Node local_78;
  
  Parsing::Parsing(&this->parsing);
  (this->words).super__Vector_base<Word,_std::allocator<Word>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->words).super__Vector_base<Word,_std::allocator<Word>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->words).super__Vector_base<Word,_std::allocator<Word>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this_00 = &this->relationOperators;
  (this->relationOperators).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->relationOperators).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->relationOperators).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->procedureTable).super__Vector_base<Procedure,_std::allocator<Procedure>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->procedureTable).super__Vector_base<Procedure,_std::allocator<Procedure>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->procedureTable).super__Vector_base<Procedure,_std::allocator<Procedure>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Node::Node(&this->root);
  this->procedureCnt = 0;
  (this->generator).interCode.super__Vector_base<InterCode,_std::allocator<InterCode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->generator).interCode.super__Vector_base<InterCode,_std::allocator<InterCode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->generator).interCode.super__Vector_base<InterCode,_std::allocator<InterCode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->generator).sizeStack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->generator).sizeStack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->generator).sizeStack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_assign((string *)this);
  std::vector<int,_std::allocator<int>_>::operator=
            (&(this->parsing).contentLine,&parsing_->contentLine);
  std::vector<int,_std::allocator<int>_>::operator=
            (&(this->parsing).contentRow,&parsing_->contentRow);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->parsing).reservationWords,&parsing_->reservationWords);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->parsing).divisionWords,&parsing_->divisionWords);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->parsing).operationWords,&parsing_->operationWords);
  (this->parsing).identifierBase = parsing_->identifierBase;
  iVar2 = parsing_->divisionBase;
  iVar3 = parsing_->operationBase;
  iVar4 = parsing_->constBase;
  (this->parsing).reservationBase = parsing_->reservationBase;
  (this->parsing).divisionBase = iVar2;
  (this->parsing).operationBase = iVar3;
  (this->parsing).constBase = iVar4;
  std::vector<Word,_std::allocator<Word>_>::operator=(&(this->parsing).words,&parsing_->words);
  std::vector<Word,_std::allocator<Word>_>::operator=(&this->words,&parsing_->words);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"");
  local_88[3] = 0;
  local_88[2] = 0;
  local_88[1] = 0;
  local_88[0] = 0;
  Word::Word((Word *)&local_78,&local_a8,local_88 + 3,local_88 + 2,local_88 + 1,local_88);
  std::vector<Word,_std::allocator<Word>_>::emplace_back<Word>(&this->words,(Word *)&local_78);
  paVar1 = &local_78.name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.name._M_dataplus._M_p,local_78.name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  this->wordIndex = -1;
  this->nodeCnt = 0;
  this->lastErrorIndex = -1;
  this->lastErrorCode = -1;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[2]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (char (*) [2])0x111141);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[2]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (char (*) [2])"#");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[2]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (char (*) [2])"<");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (char (*) [3])"<=");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[2]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (char (*) [2])">");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (char (*) [3])">=");
  mainProgram(&local_78,this);
  std::__cxx11::string::operator=((string *)&this->root,(string *)&local_78);
  (this->root).id = local_78.id;
  local_a8._M_dataplus._M_p =
       (pointer)(this->root).son.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_a8._M_string_length =
       (size_type)
       (this->root).son.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_a8.field_2._M_allocated_capacity =
       (size_type)
       (this->root).son.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->root).son.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_start = local_78.son.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
             super__Vector_impl_data._M_start;
  (this->root).son.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_78.son.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
              super__Vector_impl_data._M_finish;
  (this->root).son.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_78.son.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_78.son.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_78.son.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_78.son.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Node,_std::allocator<Node>_>::~vector
            ((vector<Node,_std::allocator<Node>_> *)&local_a8);
  (this->root).fr = local_78.fr;
  (this->root).to = local_78.to;
  std::vector<Node,_std::allocator<Node>_>::~vector(&local_78.son);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.name._M_dataplus._M_p,local_78.name.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

Lexical(const Parsing &parsing_) {
		parsing = parsing_;
		words = parsing_.words;
		words.emplace_back(Word("", 0, 0, 0, 0));
		wordIndex = -1;
		nodeCnt = 0;
		lastErrorIndex = lastErrorCode = -1;
		relationOperators.emplace_back("=");
		relationOperators.emplace_back("#");
		relationOperators.emplace_back("<");
		relationOperators.emplace_back("<=");
		relationOperators.emplace_back(">");
		relationOperators.emplace_back(">=");

		root = mainProgram();
	}